

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateMetadataPragma
          (FileGenerator *this,Printer *printer,string *info_path)

{
  byte bVar1;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  Formatter format;
  string *info_path_local;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)info_path;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::__cxx11::string::empty();
    if ((bVar1 & 1) == 0) {
      bVar1 = std::__cxx11::string::empty();
      if ((bVar1 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_78,"guard",&local_79);
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)local_58,&local_78,&(this->options_).annotation_guard_name);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,"pragma",&local_b1);
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)local_58,&local_b0,&(this->options_).annotation_pragma_name);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d8,"info_path",&local_d9);
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)local_58,&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        Formatter::operator()<>
                  ((Formatter *)local_58,
                   "#ifdef $guard$\n#pragma $pragma$ \"$info_path$\"\n#endif  // $guard$\n");
      }
    }
  }
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void FileGenerator::GenerateMetadataPragma(io::Printer* printer,
                                           const std::string& info_path) {
  Formatter format(printer, variables_);
  if (!info_path.empty() && !options_.annotation_pragma_name.empty() &&
      !options_.annotation_guard_name.empty()) {
    format.Set("guard", options_.annotation_guard_name);
    format.Set("pragma", options_.annotation_pragma_name);
    format.Set("info_path", info_path);
    format(
        "#ifdef $guard$\n"
        "#pragma $pragma$ \"$info_path$\"\n"
        "#endif  // $guard$\n");
  }
}